

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O2

Boolean convertUTF::anon_unknown_11::isLegalUTF8(UTF8 *source,int length)

{
  byte bVar1;
  byte bVar2;
  UTF8 *pUVar3;
  
  if (3 < length - 1U) {
    return false;
  }
  pUVar3 = source + length;
  switch(length) {
  case 1:
    bVar2 = *source;
    goto LAB_00196a60;
  case 2:
    goto switchD_00196a5c_caseD_2;
  case 4:
    if (-0x41 < (char)pUVar3[-1]) {
      return false;
    }
    pUVar3 = pUVar3 + -1;
  }
  if ((char)pUVar3[-1] < -0x40) {
    pUVar3 = pUVar3 + -1;
switchD_00196a5c_caseD_2:
    bVar1 = pUVar3[-1];
    if (bVar1 < 0xc0) {
      bVar2 = *source;
      if (bVar2 == 0xf4) {
        bVar2 = 0xf4;
        if (0x8f < bVar1) {
          return false;
        }
      }
      else if (bVar2 == 0xed) {
        bVar2 = 0xed;
        if (0x9f < bVar1) {
          return false;
        }
      }
      else if (bVar2 == 0xf0) {
        bVar2 = 0xf0;
        if (bVar1 < 0x90) {
          return false;
        }
      }
      else if (bVar2 == 0xe0) {
        bVar2 = 0xe0;
        if (bVar1 < 0xa0) {
          return false;
        }
      }
      else if (-1 < (char)bVar1) {
        return false;
      }
LAB_00196a60:
      return bVar2 < 0xf5 && -0x3f < (char)bVar2;
    }
  }
  return false;
}

Assistant:

Boolean isLegalUTF8(const UTF8* source, const int length)
{
    UTF8 a;
    const UTF8* srcptr = source + length;
    switch (length)
    {
    default:
        return false;
        /* Everything else falls through when "true"... */
    case 4:
        if ((a = (*--srcptr)) < 0x80 || a > 0xBF)
            return false;
        [[fallthrough]];
    case 3:
        if ((a = (*--srcptr)) < 0x80 || a > 0xBF)
            return false;
        [[fallthrough]];
    case 2:
        if ((a = (*--srcptr)) > 0xBF)
            return false;
        switch (*source)
        {
        /* no fall-through in this inner switch */
        case 0xE0:
            if (a < 0xA0)
                return false;
            break;
        case 0xED:
            if (a > 0x9F)
                return false;
            break;
        case 0xF0:
            if (a < 0x90)
                return false;
            break;
        case 0xF4:
            if (a > 0x8F)
                return false;
            break;
        default:
            if (a < 0x80)
                return false;
        }
        [[fallthrough]];
    case 1:
        if (*source >= 0x80 && *source < 0xC2)
            return false;
    }
    if (*source > 0xF4)
        return false;
    return true;
}